

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
::linear_search_impl<int,phmap::priv::upper_bound_adapter<phmap::Less<int>>>
          (btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,true>>
           *this,int *k,int s,int e,void *comp)

{
  bool bVar1;
  key_type *a;
  upper_bound_adapter<phmap::Less<int>_> *comp_local;
  int e_local;
  int s_local;
  int *k_local;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *this_local;
  
  comp_local._4_4_ = s;
  while( true ) {
    if (e <= comp_local._4_4_) {
      return (SearchResult<int,_false>)comp_local._4_4_;
    }
    a = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
        ::key((btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
               *)this,(long)comp_local._4_4_);
    bVar1 = upper_bound_adapter<phmap::Less<int>>::operator()(comp,a,k);
    if (!bVar1) break;
    comp_local._4_4_ = comp_local._4_4_ + 1;
  }
  return (SearchResult<int,_false>)comp_local._4_4_;
}

Assistant:

SearchResult<int, false> linear_search_impl(
            const K &k, int s, const int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s < e) {
                if (!comp(key(s), k)) {
                    break;
                }
                ++s;
            }
            return {s};
        }